

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O1

void __thiscall ELFIO::elfio::create_mandatory_sections(elfio *this)

{
  elf_header *peVar1;
  section *psVar2;
  string local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  psVar2 = create_section(this);
  (*psVar2->_vptr_section[0x1e])(psVar2,0);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"");
  (*psVar2->_vptr_section[4])(psVar2,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  (*psVar2->_vptr_section[0x16])(psVar2,0);
  peVar1 = this->header;
  if (peVar1 != (elf_header *)0x0) {
    (*peVar1->_vptr_elf_header[0x21])(peVar1,1);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,".shstrtab","");
  psVar2 = Sections::add(&this->sections,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  (*psVar2->_vptr_section[6])(psVar2,3);
  (*psVar2->_vptr_section[0xe])(psVar2,1);
  return;
}

Assistant:

void create_mandatory_sections()
    {
        // Create null section without calling to 'add_section' as no string
        // section containing section names exists yet
        section* sec0 = create_section();
        sec0->set_index( 0 );
        sec0->set_name( "" );
        sec0->set_name_string_offset( 0 );

        set_section_name_str_index( 1 );
        section* shstrtab = sections.add( ".shstrtab" );
        shstrtab->set_type( SHT_STRTAB );
        shstrtab->set_addr_align( 1 );
    }